

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# substring.cpp
# Opt level: O1

void duckdb::AssertInSupportedRange(idx_t input_size,int64_t offset,int64_t length)

{
  OutOfRangeException *pOVar1;
  string local_40;
  
  if (input_size >> 0x20 != 0) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Substring input size is too large (> %d)","");
    OutOfRangeException::OutOfRangeException<long>(pOVar1,&local_40,0xffffffff);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (offset < -0x100000000) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Substring offset outside of supported range (< %d)","");
    OutOfRangeException::OutOfRangeException<long>(pOVar1,&local_40,-0x100000000);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (0xffffffff < offset) {
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Substring offset outside of supported range (> %d)","");
    OutOfRangeException::OutOfRangeException<long>(pOVar1,&local_40,0xffffffff);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if (-0x100000001 < length) {
    if (length < 0x100000000) {
      return;
    }
    pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"Substring length outside of supported range (> %d)","");
    OutOfRangeException::OutOfRangeException<long>(pOVar1,&local_40,0xffffffff);
    __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pOVar1 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Substring length outside of supported range (< %d)","");
  OutOfRangeException::OutOfRangeException<long>(pOVar1,&local_40,-0x100000000);
  __cxa_throw(pOVar1,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline void AssertInSupportedRange(idx_t input_size, int64_t offset, int64_t length) {

	if (input_size > (uint64_t)SUPPORTED_UPPER_BOUND) {
		throw OutOfRangeException("Substring input size is too large (> %d)", SUPPORTED_UPPER_BOUND);
	}
	if (offset < SUPPORTED_LOWER_BOUND) {
		throw OutOfRangeException("Substring offset outside of supported range (< %d)", SUPPORTED_LOWER_BOUND);
	}
	if (offset > SUPPORTED_UPPER_BOUND) {
		throw OutOfRangeException("Substring offset outside of supported range (> %d)", SUPPORTED_UPPER_BOUND);
	}
	if (length < SUPPORTED_LOWER_BOUND) {
		throw OutOfRangeException("Substring length outside of supported range (< %d)", SUPPORTED_LOWER_BOUND);
	}
	if (length > SUPPORTED_UPPER_BOUND) {
		throw OutOfRangeException("Substring length outside of supported range (> %d)", SUPPORTED_UPPER_BOUND);
	}
}